

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_> * __thiscall
capnp::compiler::NodeTranslator::BrandScope::getParams
          (Maybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>
           *__return_storage_ptr__,BrandScope *this,uint64_t scopeId)

{
  BrandScope *this_00;
  Fault local_40;
  Fault f;
  Own<capnp::compiler::NodeTranslator::BrandScope> *p;
  uint64_t local_20;
  uint64_t scopeId_local;
  BrandScope *this_local;
  
  local_20 = scopeId;
  scopeId_local = (uint64_t)this;
  this_local = (BrandScope *)__return_storage_ptr__;
  if (scopeId == this->leafId) {
    if ((this->inherited & 1U) == 0) {
      _p = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::asPtr(&this->params);
      kj::Maybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::Maybe
                (__return_storage_ptr__,(ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl> *)&p
                );
    }
    else {
      kj::Maybe<kj::ArrayPtr<capnp::compiler::NodeTranslator::BrandedDecl>_>::Maybe
                (__return_storage_ptr__,(void *)0x0);
    }
  }
  else {
    f.exception = (Exception *)
                  kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandScope>(&this->parent);
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x30b,FAILED,(char *)0x0,"\"scope is not a parent\"",
                 (char (*) [22])"scope is not a parent");
      kj::_::Debug::Fault::fatal(&local_40);
    }
    this_00 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::get
                        ((Own<capnp::compiler::NodeTranslator::BrandScope> *)f.exception);
    getParams(__return_storage_ptr__,this_00,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::ArrayPtr<BrandedDecl>> getParams(uint64_t scopeId) {
    // Returns null if params at the requested scope should be inherited from the client scope.

    if (scopeId == leafId) {
      if (inherited) {
        return nullptr;
      } else {
        return params.asPtr();
      }
    } else KJ_IF_MAYBE(p, parent) {
      return p->get()->getParams(scopeId);
    } else {
      KJ_FAIL_REQUIRE("scope is not a parent");
    }
  }